

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
wasm::Builder::makeDataSegment
          (Name name,Name memory,bool isPassive,Expression *offset,char *init,Address size)

{
  undefined8 *puVar1;
  pointer *__ptr;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var2;
  undefined7 in_register_00000081;
  unsigned_long __n2;
  size_type in_stack_00000018;
  
  _Var2.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = name.super_IString.str._M_len;
  puVar1 = (undefined8 *)operator_new(0x50);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined8 **)
   _Var2.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
   super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = puVar1;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = memory.super_IString.str._M_len;
  puVar1[3] = memory.super_IString.str._M_str;
  puVar1[4] = CONCAT71(in_register_00000081,isPassive);
  *(char *)(puVar1 + 5) = (char)offset;
  puVar1[6] = init;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)(puVar1 + 7),in_stack_00000018);
  if (in_stack_00000018 != 0) {
    memmove(*(void **)(*(long *)_Var2.
                                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl +
                      0x38),(void *)size.addr,in_stack_00000018);
  }
  return (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
         _Var2.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
         super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<DataSegment>
  makeDataSegment(Name name = "",
                  Name memory = "",
                  bool isPassive = false,
                  Expression* offset = nullptr,
                  const char* init = "",
                  Address size = 0) {
    auto seg = std::make_unique<DataSegment>();
    seg->name = name;
    seg->memory = memory;
    seg->isPassive = isPassive;
    seg->offset = offset;
    seg->data.resize(size);
    std::copy_n(init, size, seg->data.begin());
    return seg;
  }